

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O1

void small_alloc_test(int size_min,int size_max,int objects_max,int oscillation_max,
                     int iterations_max)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  slab_cache *totals_00;
  small_alloc *psVar8;
  long lVar9;
  slab_cache *psVar10;
  long lVar11;
  undefined1 local_70 [8];
  small_stats totals;
  rlist *prStack_58;
  float actual_alloc_factor;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  psVar8 = &alloc;
  totals_00 = &cache;
  local_4c = objects_max;
  local_40 = oscillation_max;
  local_38 = size_max;
  local_34 = size_min;
  small_alloc_create(&alloc,&cache,0xc,8,1.3,(float *)((long)&totals.total + 4));
  local_3c = iterations_max;
  if (0 < iterations_max) {
    local_48 = local_38 - local_34;
    iVar2 = 0;
    do {
      local_44 = iVar2;
      iVar2 = rand();
      uVar6 = (long)iVar2 % (long)local_40 & 0xffffffff;
      if (0 < (int)((long)iVar2 % (long)local_40)) {
        do {
          iVar2 = rand();
          iVar2 = iVar2 % local_4c;
          if (local_38 <= local_34) {
LAB_001032c9:
            __assert_fail("size_max > size_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                          ,0x28,"void *alloc_checked(int, int, int)");
          }
          iVar3 = rand();
          iVar3 = iVar3 % local_48;
          psVar10 = (slab_cache *)ptrs[iVar2];
          if (psVar10 != (slab_cache *)0x0) {
            iVar1 = *(int *)&psVar10->arena;
            if (iVar1 != iVar2) {
LAB_001032ed:
              __assert_fail("ptrs[pos][0] == pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                            ,0x2c,"void *alloc_checked(int, int, int)");
            }
            if ((999 < iVar1) ||
               (uVar5 = (ulong)*(int *)((long)&psVar10->arena + 4),
               *(int *)((long)psVar10->orders + ((uVar5 & 0xfffffffffffffffc) - 0x34)) != iVar1)) {
              small_alloc_test_cold_1();
              goto LAB_001032c9;
            }
            totals_00 = (slab_cache *)ptrs[iVar1];
            if (totals_00 != psVar10) {
              small_alloc_test_cold_2();
              goto LAB_001032ed;
            }
            *(undefined4 *)((long)totals_00->orders + ((uVar5 & 0xfffffffffffffffc) - 0x34)) =
                 0x7fffffff;
            *(undefined4 *)&totals_00->arena = 0x7fffffff;
            psVar8 = &alloc;
            smfree(&alloc,totals_00,(long)*(int *)((long)&totals_00->arena + 4));
            ptrs[iVar1] = (int *)0x0;
          }
          if (allocating == true) {
            iVar3 = iVar3 + local_34;
            psVar10 = (slab_cache *)(long)iVar3;
            psVar8 = &alloc;
            totals_00 = psVar10;
            piVar4 = (int *)smalloc(&alloc,(size_t)psVar10);
            if (piVar4 == (int *)0x0) {
              small_alloc_test_cold_7();
              goto LAB_00103311;
            }
            ptrs[iVar2] = piVar4;
            *piVar4 = iVar2;
            piVar4[1] = iVar3;
            *(int *)((long)piVar4 + (((ulong)psVar10 & 0xfffffffffffffffc) - 4)) = iVar2;
          }
          uVar7 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      allocating = (_Bool)(allocating ^ 1);
      iVar2 = local_44 + 1;
    } while (iVar2 != local_3c);
  }
  lVar11 = 0;
  do {
    psVar10 = *(slab_cache **)((long)ptrs + lVar11);
    if (psVar10 != (slab_cache *)0x0) {
      lVar9 = (long)*(int *)&psVar10->arena;
      if ((999 < lVar9) ||
         (uVar6 = (ulong)*(int *)((long)&psVar10->arena + 4),
         *(int *)((long)psVar10->orders + ((uVar6 & 0xfffffffffffffffc) - 0x34)) !=
         *(int *)&psVar10->arena)) goto LAB_00103311;
      totals_00 = (slab_cache *)ptrs[lVar9];
      if (totals_00 != psVar10) goto LAB_00103316;
      *(undefined4 *)((long)totals_00->orders + ((uVar6 & 0xfffffffffffffffc) - 0x34)) = 0x7fffffff;
      *(undefined4 *)&totals_00->arena = 0x7fffffff;
      psVar8 = &alloc;
      smfree(&alloc,totals_00,(long)*(int *)((long)&totals_00->arena + 4));
      ptrs[lVar9] = (int *)0x0;
    }
    lVar11 = lVar11 + 8;
  } while (lVar11 != 8000);
  prStack_58 = (rlist *)0x0;
  psVar8 = &alloc;
  totals_00 = (slab_cache *)local_70;
  small_stats(&alloc,(small_stats *)totals_00,small_is_unused_cb,&stack0xffffffffffffffa8);
  if (local_70 == (undefined1  [8])0x0) {
    if (cache.allocated.stats.used <= prStack_58) {
      small_alloc_destroy(&alloc);
      return;
    }
    goto LAB_00103320;
  }
LAB_0010331b:
  small_alloc_test_cold_5();
LAB_00103320:
  small_alloc_test_cold_6();
  totals_00->arena =
       (slab_arena *)
       ((long)&(totals_00->arena->cache).next +
       (ulong)(uint)(*(int *)((long)&psVar8->small_mempool_cache[0].pool.cache + 4) *
                    *(int *)&psVar8->small_mempool_cache[0].pool.cache));
  return;
LAB_00103311:
  small_alloc_test_cold_3();
LAB_00103316:
  small_alloc_test_cold_4();
  goto LAB_0010331b;
}

Assistant:

static void
small_alloc_test(int size_min, int size_max, int objects_max,
		 int oscillation_max, int iterations_max)
{
	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache, OBJSIZE_MIN,
			   sizeof(intptr_t), 1.3,
			   &actual_alloc_factor);

	for (int i = 0; i < iterations_max; i++) {
		int oscillation = rand() % oscillation_max;
		for (int j = 0; j < oscillation; ++j) {
			int pos = rand() % objects_max;
			alloc_checked(pos, size_min, size_max);
		}
		allocating = ! allocating;
	}

	for (int pos = 0; pos < OBJECTS_MAX; pos++) {
		if (ptrs[pos] != NULL)
			free_checked(ptrs[pos]);
	}

	small_check_unused();

	small_alloc_destroy(&alloc);
}